

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsValueRef
WScriptJsrt::LoadTextFileCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  char *pcVar1;
  JsErrorCode JVar2;
  HRESULT HVar3;
  PAL_FILE *stream;
  undefined1 auStack_58 [8];
  AutoString fileName;
  UINT local_2c;
  char *pcStack_28;
  UINT lengthBytes;
  char *fileContent;
  JsValueRef returnValue;
  
  fileContent = (char *)0x0;
  pcStack_28 = (char *)0x0;
  if (argumentCount < 2) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&fileContent);
  }
  else {
    fileName.data._0_5_ = 0;
    fileName._13_8_ = 0;
    auStack_58 = (undefined1  [8])0x0;
    fileName.length._0_5_ = 0;
    fileName.length._5_3_ = 0;
    JVar2 = AutoString::Initialize((AutoString *)auStack_58,arguments[1]);
    if (JVar2 == JsNoError) {
      local_2c = 0;
      HVar3 = Helpers::LoadScriptFromFile
                        ((LPCSTR)CONCAT35(fileName.length._5_3_,(undefined5)fileName.length),
                         &stack0xffffffffffffffd8,&local_2c,(string *)0x0,false);
      if (HVar3 < 0) {
        stream = PAL_get_stderr(0);
        PAL_fprintf(stream,"Couldn\'t load file \'%s\'\n",
                    CONCAT35(fileName.length._5_3_,(undefined5)fileName.length));
        JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&fileContent);
        pcVar1 = fileContent;
        AutoString::~AutoString((AutoString *)auStack_58);
        if (JVar2 == JsNoError) {
          return pcVar1;
        }
        goto LAB_00110a77;
      }
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                (pcStack_28,(size_t)local_2c,&fileContent);
    }
    AutoString::~AutoString((AutoString *)auStack_58);
  }
LAB_00110a77:
  free(pcStack_28);
  return fileContent;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::LoadTextFileCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;
    const char* fileContent = nullptr;

    if (argumentCount < 2)
    {
        IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));
    }
    else
    {
        AutoString fileName;

        IfJsrtErrorSetGo(fileName.Initialize(arguments[1]));

        if (errorCode == JsNoError)
        {
            UINT lengthBytes = 0;
            hr = Helpers::LoadScriptFromFile(*fileName, fileContent, &lengthBytes);

            if (FAILED(hr))
            {
                fprintf(stderr, "Couldn't load file '%s'\n", fileName.GetString());
                IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));
                return returnValue;
            }

            IfJsrtErrorSetGo(ChakraRTInterface::JsCreateString(
                fileContent, lengthBytes, &returnValue));
        }
    }

Error:
    if (fileContent)
    {
        free((void*)fileContent);
    }
    return returnValue;
}